

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::relocate
          (QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,
          qsizetype offset,_func_QVariant_void_ptr_void_ptr_double ***data)

{
  bool bVar1;
  _func_QVariant_void_ptr_void_ptr_double **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  _func_QVariant_void_ptr_void_ptr_double **res;
  
  first = (_func_QVariant_void_ptr_void_ptr_double **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QVariant(*)(void_const*,void_const*,double),long_long>
            (first,in_RDI,(_func_QVariant_void_ptr_void_ptr_double **)0x697277);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QVariant(*)(void_const*,void_const*,double)>,QVariant(*const*)(void_const*,void_const*,double)>
                        (data,(QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)> *
                              )res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(_func_QVariant_void_ptr_void_ptr_double ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }